

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O3

exr_result_t exr_attr_float_vector_init(exr_context_t ctxt,exr_attr_float_vector_t *fv,int32_t nent)

{
  exr_result_t eVar1;
  float *pfVar2;
  char *pcVar3;
  code *UNRECOVERED_JUMPTABLE;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (nent < 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
    pcVar3 = "Received request to allocate negative sized float vector (%d entries)";
  }
  else {
    if ((ulong)((long)nent << 2) >> 0x1f == 0) {
      if (fv == (exr_attr_float_vector_t *)0x0) {
        eVar1 = (**(code **)(ctxt + 0x40))
                          (ctxt,3,"Invalid reference to float vector object to initialize");
        return eVar1;
      }
      fv->length = 0;
      fv->alloc_size = 0;
      fv->arr = (float *)0x0;
      if (nent == 0) {
        return 0;
      }
      pfVar2 = (float *)(**(code **)(ctxt + 0x58))();
      fv->arr = pfVar2;
      if (pfVar2 != (float *)0x0) {
        fv->length = nent;
        fv->alloc_size = nent;
        return 0;
      }
      eVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
      return eVar1;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
    pcVar3 = "Invalid too large size for float vector (%d entries)";
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar3,nent,UNRECOVERED_JUMPTABLE);
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

/* allocates ram, but does not fill any data */
exr_result_t
exr_attr_float_vector_init (
    exr_context_t ctxt, exr_attr_float_vector_t* fv, int32_t nent)
{
    exr_attr_float_vector_t nil   = {0};
    size_t                  bytes = (size_t) (nent) * sizeof (float);

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (nent < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized float vector (%d entries)",
            nent);
    if (bytes > (size_t) INT32_MAX)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid too large size for float vector (%d entries)",
            nent);
    if (!fv)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float vector object to initialize");

    *fv = nil;
    if (bytes > 0)
    {
        fv->arr = (float*) pctxt->alloc_fn (bytes);
        if (fv->arr == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
        fv->length     = nent;
        fv->alloc_size = nent;
    }

    return EXR_ERR_SUCCESS;
}